

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

boolean in_fcorridor(monst *grd,int x,int y)

{
  int local_24;
  int fci;
  int y_local;
  int x_local;
  monst *grd_local;
  
  local_24 = *(int *)&grd->field_0x74;
  while( true ) {
    if (*(int *)&grd[1].nmon <= local_24) {
      return '\0';
    }
    if ((x == *(char *)((long)grd[1].mtrack + (long)local_24 * 3 + -0x34)) &&
       (y == *(char *)((long)grd[1].mtrack + (long)local_24 * 3 + -0x33))) break;
    local_24 = local_24 + 1;
  }
  return '\x01';
}

Assistant:

static boolean in_fcorridor(struct monst *grd, int x, int y)
{
	int fci;

	for (fci = EGD(grd)->fcbeg; fci < EGD(grd)->fcend; fci++)
		if (x == EGD(grd)->fakecorr[fci].fx &&
				y == EGD(grd)->fakecorr[fci].fy)
			return TRUE;
	return FALSE;
}